

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

SharedPtr<deqp::egl::GLES2ThreadTest::Surface> __thiscall
deqp::egl::GLES2ThreadTest::EGLResourceManager::popSurface(EGLResourceManager *this,int index)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> SVar2;
  
  lVar1 = CONCAT44(in_register_00000034,index);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)this,
             (SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)
             (*(long *)(lVar1 + 0x18) + (long)in_EDX * 0x10));
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>
  ::erase((vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>_>_>
           *)(lVar1 + 0x18),
          (SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)
          ((long)in_EDX * 0x10 + *(long *)(lVar1 + 0x18)));
  SVar2.m_state = extraout_RDX;
  SVar2.m_ptr = (Surface *)this;
  return SVar2;
}

Assistant:

SharedPtr<Surface> EGLResourceManager::popSurface (int index)
{
	SharedPtr<Surface> surface = m_surfaces[index];
	m_surfaces.erase(m_surfaces.begin() + index);
	return surface;
}